

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_flac_read_pcm_frames
                    (ma_flac *pFlac,void *pFramesOut,ma_uint64 frameCount,ma_uint64 *pFramesRead)

{
  ma_format mVar1;
  ma_result mVar2;
  ma_uint64 mVar3;
  
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = 0;
  }
  mVar2 = MA_INVALID_ARGS;
  if (pFlac != (ma_flac *)0x0 && frameCount != 0) {
    mVar1 = pFlac->format;
    if (mVar1 == ma_format_s16) {
      mVar3 = ma_dr_flac_read_pcm_frames_s16(pFlac->dr,frameCount,(ma_int16 *)pFramesOut);
    }
    else if (mVar1 == ma_format_s32) {
      mVar3 = ma_dr_flac_read_pcm_frames_s32(pFlac->dr,frameCount,(ma_int32 *)pFramesOut);
    }
    else {
      if (mVar1 != ma_format_f32) {
        return MA_INVALID_OPERATION;
      }
      mVar3 = ma_dr_flac_read_pcm_frames_f32(pFlac->dr,frameCount,(float *)pFramesOut);
    }
    mVar2 = MA_AT_END;
    if (mVar3 != 0) {
      mVar2 = MA_SUCCESS;
    }
    if (pFramesRead != (ma_uint64 *)0x0) {
      *pFramesRead = mVar3;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_flac_read_pcm_frames(ma_flac* pFlac, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pFlac == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_FLAC)
    {
        /* We always use floating point format. */
        ma_result result = MA_SUCCESS;  /* Must be initialized to MA_SUCCESS. */
        ma_uint64 totalFramesRead = 0;
        ma_format format;

        ma_flac_get_data_format(pFlac, &format, NULL, NULL, NULL, 0);

        switch (format)
        {
            case ma_format_f32:
            {
                totalFramesRead = ma_dr_flac_read_pcm_frames_f32(pFlac->dr, frameCount, (float*)pFramesOut);
            } break;

            case ma_format_s16:
            {
                totalFramesRead = ma_dr_flac_read_pcm_frames_s16(pFlac->dr, frameCount, (ma_int16*)pFramesOut);
            } break;

            case ma_format_s32:
            {
                totalFramesRead = ma_dr_flac_read_pcm_frames_s32(pFlac->dr, frameCount, (ma_int32*)pFramesOut);
            } break;

            case ma_format_u8:
            case ma_format_s24:
            case ma_format_unknown:
            default:
            {
                return MA_INVALID_OPERATION;
            };
        }

        /* In the future we'll update ma_dr_flac to return MA_AT_END for us. */
        if (totalFramesRead == 0) {
            result = MA_AT_END;
        }

        if (pFramesRead != NULL) {
            *pFramesRead = totalFramesRead;
        }

        if (result == MA_SUCCESS && totalFramesRead == 0) {
            result  = MA_AT_END;
        }

        return result;
    }
    #else
    {
        /* flac is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)pFramesOut;
        (void)frameCount;
        (void)pFramesRead;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}